

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_streambuf.hpp
# Opt level: O0

void __thiscall
asio::basic_streambuf_ref<std::allocator<char>_>::commit
          (basic_streambuf_ref<std::allocator<char>_> *this,size_t n)

{
  size_t n_local;
  basic_streambuf_ref<std::allocator<char>_> *this_local;
  
  basic_streambuf<std::allocator<char>_>::commit(this->sb_,n);
  return;
}

Assistant:

void commit(std::size_t n)
  {
    return sb_.commit(n);
  }